

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::Stream::printError(Stream *this,Node *N,Twine *Msg)

{
  _Head_base<0UL,_llvm::yaml::Scanner_*,_false> _Var1;
  SMLoc Loc;
  ArrayRef<llvm::SMRange> Ranges;
  SMRange local_18;
  
  if (N == (Node *)0x0) {
    local_18.Start.Ptr._0_4_ = 0;
    local_18.Start.Ptr._4_4_ = 0;
    local_18.End.Ptr._0_4_ = 0;
    local_18.End.Ptr._4_4_ = 0;
  }
  else {
    local_18.Start.Ptr._0_4_ = *(undefined4 *)&(N->SourceRange).Start.Ptr;
    local_18.Start.Ptr._4_4_ = *(undefined4 *)((long)&(N->SourceRange).Start.Ptr + 4);
    local_18.End.Ptr._0_4_ = *(undefined4 *)&(N->SourceRange).End.Ptr;
    local_18.End.Ptr._4_4_ = *(undefined4 *)((long)&(N->SourceRange).End.Ptr + 4);
  }
  _Var1._M_head_impl =
       (this->scanner)._M_t.
       super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>._M_t.
       super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>.
       super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>._M_head_impl;
  Loc.Ptr._4_4_ = local_18.Start.Ptr._4_4_;
  Loc.Ptr._0_4_ = local_18.Start.Ptr._0_4_;
  Ranges.Length = 1;
  Ranges.Data = &local_18;
  SourceMgr::PrintMessage
            ((_Var1._M_head_impl)->SM,Loc,DK_Error,Msg,Ranges,(ArrayRef<llvm::SMFixIt>)ZEXT816(0),
             (_Var1._M_head_impl)->ShowColors);
  return;
}

Assistant:

void Stream::printError(Node *N, const Twine &Msg) {
  SMRange Range = N ? N->getSourceRange() : SMRange();
  scanner->printError( Range.Start
                     , SourceMgr::DK_Error
                     , Msg
                     , Range);
}